

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O2

int av1_get_pred_context_switchable_interp(MACROBLOCKD *xd,int dir)

{
  char cVar1;
  MB_MODE_INFO **ppMVar2;
  MB_MODE_INFO *pMVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  ppMVar2 = xd->mi;
  cVar1 = (*ppMVar2)->ref_frame[0];
  uVar6 = 3;
  uVar4 = uVar6;
  if ((xd->left_available == true) &&
     ((pMVar3 = ppMVar2[-1], pMVar3->ref_frame[0] == cVar1 || (pMVar3->ref_frame[1] == cVar1)))) {
    uVar4 = (pMVar3->interp_filters).as_int >> ((byte)(dir << 4) & 0x1f) & 0xff;
  }
  if ((xd->up_available == true) &&
     ((pMVar3 = ppMVar2[-(long)xd->mi_stride], pMVar3->ref_frame[0] == cVar1 ||
      (pMVar3->ref_frame[1] == cVar1)))) {
    uVar6 = (pMVar3->interp_filters).as_int >> ((byte)(dir << 4) & 0x1f) & 0xff;
  }
  uVar5 = (dir * 8 & 8U) + (uint)('\0' < (*ppMVar2)->ref_frame[1]) * 4;
  if (uVar4 != uVar6) {
    if (uVar4 == 3) {
      return uVar6 + uVar5;
    }
    if (uVar6 != 3) {
      return uVar5 | 3;
    }
  }
  return uVar4 + uVar5;
}

Assistant:

int av1_get_pred_context_switchable_interp(const MACROBLOCKD *xd, int dir) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int ctx_offset =
      (mbmi->ref_frame[1] > INTRA_FRAME) * INTER_FILTER_COMP_OFFSET;
  assert(dir == 0 || dir == 1);
  const MV_REFERENCE_FRAME ref_frame = mbmi->ref_frame[0];
  // Note:
  // The mode info data structure has a one element border above and to the
  // left of the entries corresponding to real macroblocks.
  // The prediction flags in these dummy entries are initialized to 0.
  int filter_type_ctx = ctx_offset + (dir & 0x01) * INTER_FILTER_DIR_OFFSET;
  int left_type = SWITCHABLE_FILTERS;
  int above_type = SWITCHABLE_FILTERS;

  if (xd->left_available)
    left_type = get_ref_filter_type(xd->mi[-1], xd, dir, ref_frame);

  if (xd->up_available)
    above_type =
        get_ref_filter_type(xd->mi[-xd->mi_stride], xd, dir, ref_frame);

  if (left_type == above_type) {
    filter_type_ctx += left_type;
  } else if (left_type == SWITCHABLE_FILTERS) {
    assert(above_type != SWITCHABLE_FILTERS);
    filter_type_ctx += above_type;
  } else if (above_type == SWITCHABLE_FILTERS) {
    assert(left_type != SWITCHABLE_FILTERS);
    filter_type_ctx += left_type;
  } else {
    filter_type_ctx += SWITCHABLE_FILTERS;
  }

  return filter_type_ctx;
}